

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::IncludeScope::IncludeScope
          (IncludeScope *this,cmMakefile *mf,string *filenametoread,bool noPolicyScope)

{
  PolicyStatus PVar1;
  undefined7 in_register_00000009;
  PolicyMap local_38;
  
  this->Makefile = mf;
  this->NoPolicyScope = noPolicyScope;
  this->CheckCMP0011 = false;
  this->ReportError = true;
  if ((int)CONCAT71(in_register_00000009,noPolicyScope) == 0) {
    PVar1 = GetPolicyStatus(mf,CMP0011);
    switch(PVar1) {
    case OLD:
      this->NoPolicyScope = true;
      break;
    case WARN:
      local_38.Status.super__Base_bitset<5UL>._M_w[2] = 0;
      local_38.Status.super__Base_bitset<5UL>._M_w[3] = 0;
      local_38.Status.super__Base_bitset<5UL>._M_w[0] = 0;
      local_38.Status.super__Base_bitset<5UL>._M_w[1] = 0;
      local_38.Status.super__Base_bitset<5UL>._M_w[4] = 0;
      PushPolicy(this->Makefile,true,&local_38);
      this->CheckCMP0011 = true;
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      this->CheckCMP0011 = true;
    case NEW:
      local_38.Status.super__Base_bitset<5UL>._M_w[2] = 0;
      local_38.Status.super__Base_bitset<5UL>._M_w[3] = 0;
      local_38.Status.super__Base_bitset<5UL>._M_w[0] = 0;
      local_38.Status.super__Base_bitset<5UL>._M_w[1] = 0;
      local_38.Status.super__Base_bitset<5UL>._M_w[4] = 0;
      PushPolicy(this->Makefile,false,&local_38);
    }
  }
  PushPolicyBarrier(this->Makefile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Makefile->ListFileStack,filenametoread);
  return;
}

Assistant:

cmMakefile::IncludeScope::IncludeScope(cmMakefile* mf,
                                       std::string const& filenametoread,
                                       bool noPolicyScope):
  Makefile(mf), NoPolicyScope(noPolicyScope),
  CheckCMP0011(false), ReportError(true)
{
  if(!this->NoPolicyScope)
    {
    // Check CMP0011 to determine the policy scope type.
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0011))
      {
      case cmPolicies::WARN:
        // We need to push a scope to detect whether the script sets
        // any policies that would affect the includer and therefore
        // requires a warning.  We use a weak scope to simulate OLD
        // behavior by allowing policy changes to affect the includer.
        this->Makefile->PushPolicy(true);
        this->CheckCMP0011 = true;
        break;
      case cmPolicies::OLD:
        // OLD behavior is to not push a scope at all.
        this->NoPolicyScope = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        // We should never make this policy required, but we handle it
        // here just in case.
        this->CheckCMP0011 = true;
      case cmPolicies::NEW:
        // NEW behavior is to push a (strong) scope.
        this->Makefile->PushPolicy();
        break;
      }
    }

  // The included file cannot pop our policy scope.
  this->Makefile->PushPolicyBarrier();
  this->Makefile->ListFileStack.push_back(filenametoread);
}